

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O0

void fmt::v7::
     print<std::basic_string_view<char,std::char_traits<char>>,int_const&,long_double_const&,int_const&,char>
               (FILE *f,basic_string_view<char,_std::char_traits<char>_> *format_str,int *args,
               longdouble *args_1,int *args_2)

{
  basic_string_view<char,_std::char_traits<char>_> *f_00;
  char *extraout_RDX;
  remove_reference_t<const_int_&> *in_R9;
  std_string_view<char> s;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  local_c8;
  v7 *local_b8;
  size_t local_b0;
  string_view local_a8;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_int,_const_long_double,_const_int>
  local_98;
  FILE *local_60;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_int,_const_long_double,_const_int>
  *vargs;
  int *args_local_2;
  longdouble *args_local_1;
  int *args_local;
  basic_string_view<char,_std::char_traits<char>_> *format_str_local;
  FILE *f_local;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_28;
  FILE *local_20;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_18;
  FILE *local_10;
  
  vargs = (format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_int,_const_long_double,_const_int>
           *)args_2;
  args_local_2 = (int *)args_1;
  args_local_1 = (longdouble *)args;
  args_local = (int *)format_str;
  format_str_local = (basic_string_view<char,_std::char_traits<char>_> *)f;
  make_args_checked<int_const&,long_double_const&,int_const&,std::basic_string_view<char,std::char_traits<char>>,char>
            (&local_98,(v7 *)format_str,(basic_string_view<char,_std::char_traits<char>_> *)args,
             (remove_reference_t<const_int_&> *)args_1,
             (remove_reference_t<const_long_double_&> *)args_2,in_R9);
  f_00 = format_str_local;
  local_60 = (FILE *)&local_98;
  local_b8 = *(v7 **)args_local;
  local_b0 = *(size_t *)(args_local + 2);
  s._M_str = extraout_RDX;
  s._M_len = local_b0;
  local_a8 = to_string_view<char,_0>(local_b8,s);
  local_28 = &local_c8;
  f_local = local_60;
  local_20 = local_60;
  local_10 = local_60;
  local_18 = local_28;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>::
  basic_format_args(local_28,0x1b1,
                    (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                     *)local_60);
  vprint((FILE *)f_00,local_a8,(format_args)local_c8);
  return;
}

Assistant:

inline void print(std::FILE* f, const S& format_str, Args&&... args) {
  const auto& vargs = fmt::make_args_checked<Args...>(format_str, args...);
  return detail::is_unicode<Char>()
             ? vprint(f, to_string_view(format_str), vargs)
             : detail::vprint_mojibake(f, to_string_view(format_str), vargs);
}